

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * create_reference(cJSON *item,internal_hooks *hooks)

{
  byte *pbVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  char *pcVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  cJSON *pcVar9;
  
  if ((item != (cJSON *)0x0) &&
     (pcVar9 = (cJSON *)(*global_hooks.allocate)(0x40), pcVar9 != (cJSON *)0x0)) {
    pcVar9->valuedouble = 0.0;
    pcVar9->string = (char *)0x0;
    pcVar9->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar9->valueint = 0;
    pcVar9->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar9->type = 0;
    pcVar9->next = (cJSON *)0x0;
    pcVar9->prev = (cJSON *)0x0;
    pcVar2 = item->next;
    pcVar3 = item->prev;
    iVar5 = item->type;
    uVar6 = *(undefined4 *)&item->field_0x1c;
    pcVar4 = item->valuestring;
    iVar7 = item->valueint;
    uVar8 = *(undefined4 *)&item->field_0x2c;
    pcVar9->child = item->child;
    pcVar9->type = iVar5;
    *(undefined4 *)&pcVar9->field_0x1c = uVar6;
    pcVar9->next = pcVar2;
    pcVar9->prev = pcVar3;
    pcVar9->valuestring = pcVar4;
    pcVar9->valueint = iVar7;
    *(undefined4 *)&pcVar9->field_0x2c = uVar8;
    pcVar9->valuedouble = item->valuedouble;
    pcVar9->string = (char *)0x0;
    pbVar1 = (byte *)((long)&pcVar9->type + 1);
    *pbVar1 = *pbVar1 | 1;
    pcVar9->next = (cJSON *)0x0;
    pcVar9->prev = (cJSON *)0x0;
    return pcVar9;
  }
  return (cJSON *)0x0;
}

Assistant:

static cJSON *create_reference(const cJSON *item, const internal_hooks * const hooks)
{
    cJSON *reference = NULL;
    if (item == NULL)
    {
        return NULL;
    }

    reference = cJSON_New_Item(hooks);
    if (reference == NULL)
    {
        return NULL;
    }

    memcpy(reference, item, sizeof(cJSON));
    reference->string = NULL;
    reference->type |= cJSON_IsReference;
    reference->next = reference->prev = NULL;
    return reference;
}